

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O1

QPoint __thiscall QPushButtonPrivate::adjustedMenuPosition(QPushButtonPrivate *this)

{
  QWidget *this_00;
  int iVar1;
  Orientation OVar2;
  uint uVar3;
  uint uVar4;
  LayoutDirection LVar5;
  QToolBar *this_01;
  undefined8 uVar6;
  QPoint QVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  Representation RVar11;
  Representation RVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QRect QVar15;
  undefined1 auVar16 [16];
  Representation local_90;
  int local_88;
  QPoint local_68;
  QPoint local_60;
  QWidgetItem local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (this_01 == (QToolBar *)0x0) {
    bVar14 = true;
  }
  else {
    OVar2 = QToolBar::orientation(this_01);
    bVar14 = OVar2 != Vertical;
  }
  local_58.super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
  local_58.super_QLayoutItem._12_4_ = 0xaaaaaaaa;
  local_58.super_QLayoutItem._vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007f4ef8;
  local_58.wid = this_00;
  QVar15 = QWidgetItem::geometry(&local_58);
  uVar3 = QWidget::x(this_00);
  RVar12.m_i = QVar15.x1.m_i.m_i - uVar3;
  uVar4 = QWidget::y(this_00);
  RVar11.m_i = QVar15.y1.m_i.m_i - uVar4;
  iVar8 = (QVar15.x2.m_i.m_i + 1) - QVar15.x1.m_i;
  uVar6 = (**(code **)(*(long *)(this->menu).wp.value + 0x70))();
  local_60.yp.m_i = RVar11.m_i;
  local_60.xp.m_i = RVar12.m_i;
  QVar7 = QWidget::mapToGlobal(this_00,&local_60);
  uVar13 = (ulong)QVar7 >> 0x20;
  lVar9 = (long)(int)(~uVar3 + QVar15.x2.m_i.m_i + 1) + (long)RVar12.m_i;
  lVar10 = (long)(int)(~uVar4 + 1 + QVar15.y2.m_i.m_i) + (long)RVar11.m_i;
  local_68 = (QPoint)((ulong)(lVar9 - (lVar9 >> 0x3f)) >> 1 & 0xffffffff |
                     (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
  local_60 = QWidget::mapToGlobal(this_00,&local_68);
  QWidgetPrivate::screen(this_00,&local_60,true);
  auVar16 = QScreen::availableGeometry();
  local_90 = QVar7.xp.m_i;
  local_88 = (int)uVar6;
  if (bVar14) {
    RVar12 = QVar7.yp.m_i;
    uVar3 = ((QVar15.y2.m_i.m_i + 1) - QVar15.y1.m_i) + RVar12.m_i;
    iVar1 = (int)((ulong)uVar6 >> 0x20);
    RVar11.m_i = RVar12.m_i - iVar1;
    if (RVar11.m_i < auVar16._4_4_) {
      RVar11.m_i = RVar12.m_i;
    }
    if ((int)(uVar3 + iVar1) <= auVar16._12_4_) {
      RVar11.m_i = uVar3;
    }
    uVar13 = (ulong)(uint)RVar11.m_i;
    LVar5 = QWidget::layoutDirection(this_00);
    if (LVar5 != RightToLeft) goto LAB_0047423f;
    uVar3 = (iVar8 - local_88) + local_90.m_i;
  }
  else {
    uVar3 = iVar8 + local_90.m_i;
    iVar8 = (**(code **)(*(long *)(this->menu).wp.value + 0x70))();
    if (auVar16._8_4_ < (int)(iVar8 + uVar3)) {
      RVar11.m_i = local_90.m_i - local_88;
      if (local_90.m_i - local_88 < auVar16._0_4_) {
        RVar11.m_i = local_90.m_i;
      }
      QVar7.yp.m_i = 0;
      QVar7.xp.m_i = RVar11.m_i;
      goto LAB_0047423f;
    }
  }
  QVar7.yp.m_i = 0;
  QVar7.xp.m_i = uVar3;
LAB_0047423f:
  QWidgetItem::~QWidgetItem(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QPoint)((ulong)QVar7 & 0xffffffff | uVar13 << 0x20);
}

Assistant:

QPoint QPushButtonPrivate::adjustedMenuPosition()
{
    Q_Q(QPushButton);

    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif

    QWidgetItem item(q);
    QRect rect = item.geometry();
    rect.setRect(rect.x() - q->x(), rect.y() - q->y(), rect.width(), rect.height());

    QSize menuSize = menu->sizeHint();
    QPoint globalPos = q->mapToGlobal(rect.topLeft());
    int x = globalPos.x();
    int y = globalPos.y();
    const QRect availableGeometry = QWidgetPrivate::availableScreenGeometry(q, q->mapToGlobal(rect.center()));
    if (horizontal) {
        if (globalPos.y() + rect.height() + menuSize.height() <= availableGeometry.bottom()) {
            y += rect.height();
        } else if (globalPos.y() - menuSize.height() >= availableGeometry.y()) {
            y -= menuSize.height();
        }
        if (q->layoutDirection() == Qt::RightToLeft)
            x += rect.width() - menuSize.width();
    } else {
        if (globalPos.x() + rect.width() + menu->sizeHint().width() <= availableGeometry.right()) {
            x += rect.width();
        } else if (globalPos.x() - menuSize.width() >= availableGeometry.x()) {
            x -= menuSize.width();
        }
    }

    return QPoint(x,y);
}